

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::
     UnaryScatter<duckdb::QuantileState<float,duckdb::QuantileStandardType>,float,duckdb::QuantileListOperation<float,true>>
               (Vector *input,Vector *states,AggregateInputData *aggr_input_data,idx_t count)

{
  float *idata;
  QuantileState<float,_duckdb::QuantileStandardType> **states_00;
  FunctionData *pFVar1;
  vector<float,_std::allocator<float>_> *pvVar2;
  iterator iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  AggregateUnaryInput input_data;
  UnifiedVectorFormat sdata;
  float local_c4;
  AggregateUnaryInput local_c0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  long *local_78;
  long local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  if ((*input == (Vector)0x2) && (*states == (Vector)0x2)) {
    if ((*(byte **)(input + 0x28) == (byte *)0x0) || ((**(byte **)(input + 0x28) & 1) != 0)) {
      local_c0.input_mask = (ValidityMask *)(input + 0x28);
      local_c0.input_idx = 0;
      local_c0.input = aggr_input_data;
      QuantileOperation::
      ConstantOperation<float,duckdb::QuantileState<float,duckdb::QuantileStandardType>,duckdb::QuantileListOperation<float,true>>
                ((QuantileState<float,_duckdb::QuantileStandardType> *)
                 **(undefined8 **)(states + 0x20),*(float **)(input + 0x20),&local_c0,count);
    }
  }
  else {
    if (*input == (Vector)0x0 && *states == (Vector)0x0) {
      idata = *(float **)(input + 0x20);
      states_00 = *(QuantileState<float,_duckdb::QuantileStandardType> ***)(states + 0x20);
      FlatVector::VerifyFlatVector(input);
      UnaryFlatLoop<duckdb::QuantileState<float,duckdb::QuantileStandardType>,float,duckdb::QuantileListOperation<float,true>>
                (idata,aggr_input_data,states_00,(ValidityMask *)(input + 0x28),count);
      return;
    }
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_c0);
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
    duckdb::Vector::ToUnifiedFormat((ulong)input,(UnifiedVectorFormat *)count);
    duckdb::Vector::ToUnifiedFormat((ulong)states,(UnifiedVectorFormat *)count);
    if (local_c0.input_idx == 0) {
      if (count != 0) {
        uVar6 = 0;
        do {
          pFVar1 = ((local_c0.input)->bind_data).ptr;
          uVar4 = uVar6;
          if (pFVar1 != (FunctionData *)0x0) {
            uVar4 = (ulong)*(uint *)(pFVar1 + uVar6 * 4);
          }
          uVar5 = uVar6;
          if (*local_78 != 0) {
            uVar5 = (ulong)*(uint *)(*local_78 + uVar6 * 4);
          }
          pvVar2 = *(vector<float,_std::allocator<float>_> **)(local_70 + uVar5 * 8);
          local_c4 = *(float *)((long)&((local_c0.input_mask)->
                                       super_TemplatedValidityMask<unsigned_long>).validity_mask +
                               uVar4 * 4);
          iVar3._M_current =
               (pvVar2->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (pvVar2->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                      (pvVar2,iVar3,&local_c4);
          }
          else {
            *iVar3._M_current = local_c4;
            (pvVar2->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar3._M_current + 1;
          }
          uVar6 = uVar6 + 1;
        } while (count != uVar6);
      }
    }
    else if (count != 0) {
      uVar6 = 0;
      do {
        pFVar1 = ((local_c0.input)->bind_data).ptr;
        uVar4 = uVar6;
        if (pFVar1 != (FunctionData *)0x0) {
          uVar4 = (ulong)*(uint *)(pFVar1 + uVar6 * 4);
        }
        uVar5 = uVar6;
        if (*local_78 != 0) {
          uVar5 = (ulong)*(uint *)(*local_78 + uVar6 * 4);
        }
        if ((local_c0.input_idx == 0) ||
           ((*(ulong *)(local_c0.input_idx + (uVar4 >> 6) * 8) >> (uVar4 & 0x3f) & 1) != 0)) {
          pvVar2 = *(vector<float,_std::allocator<float>_> **)(local_70 + uVar5 * 8);
          local_c4 = *(float *)((long)&((local_c0.input_mask)->
                                       super_TemplatedValidityMask<unsigned_long>).validity_mask +
                               uVar4 * 4);
          iVar3._M_current =
               (pvVar2->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (pvVar2->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                      (pvVar2,iVar3,&local_c4);
          }
          else {
            *iVar3._M_current = local_c4;
            (pvVar2->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar3._M_current + 1;
          }
        }
        uVar6 = uVar6 + 1;
      } while (count != uVar6);
    }
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    }
    if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
    }
    if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
    }
  }
  return;
}

Assistant:

static void UnaryScatter(Vector &input, Vector &states, AggregateInputData &aggr_input_data, idx_t count) {
		if (input.GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				// constant NULL input in function that ignores NULL values
				return;
			}
			// regular constant: get first state
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(**sdata, *idata, input_data, count);
#ifndef DUCKDB_SMALLER_BINARY
		} else if (input.GetVectorType() == VectorType::FLAT_VECTOR &&
		           states.GetVectorType() == VectorType::FLAT_VECTOR) {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			UnaryFlatLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, sdata, FlatVector::Validity(input),
			                                          count);
#endif
		} else {
			UnifiedVectorFormat idata, sdata;
			input.ToUnifiedFormat(count, idata);
			states.ToUnifiedFormat(count, sdata);
			UnaryScatterLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                             aggr_input_data, (STATE_TYPE **)sdata.data, *idata.sel,
			                                             *sdata.sel, idata.validity, count);
		}
	}